

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AppendFlagEscape(cmLocalGenerator *this,string *flags,string *rawFlag)

{
  string_view str;
  bool unescapeNinjaConfiguration;
  string local_40;
  string *local_20;
  string *rawFlag_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  local_20 = rawFlag;
  rawFlag_local = flags;
  flags_local = (string *)this;
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)rawFlag);
  unescapeNinjaConfiguration = IsNinjaMulti(this);
  cmOutputConverter::EscapeForShell_abi_cxx11_
            (&local_40,&this->super_cmOutputConverter,str,false,false,false,
             unescapeNinjaConfiguration,false);
  (*this->_vptr_cmLocalGenerator[6])(this,flags,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmLocalGenerator::AppendFlagEscape(std::string& flags,
                                        const std::string& rawFlag) const
{
  this->AppendFlags(
    flags,
    this->EscapeForShell(rawFlag, false, false, false, this->IsNinjaMulti()));
}